

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O2

filepos_t __thiscall
libmatroska::KaxInternalBlock::ReadData
          (KaxInternalBlock *this,IOCallback *input,ScopeMode ReadFully)

{
  vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_> *this_00;
  byte bVar1;
  KaxInternalBlock *pKVar2;
  undefined1 uVar3;
  byte bVar4;
  ushort uVar5;
  uint16 uVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var_00;
  filepos_t fVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined7 extraout_var;
  undefined8 *puVar10;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  EndOfStreamX *pEVar11;
  undefined4 extraout_var_08;
  binary *pbVar12;
  uint64 uVar13;
  int64 iVar14;
  size_t sVar15;
  DataBuffer *pDVar16;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  LacingType LVar17;
  pointer piVar18;
  ulong uVar19;
  long lVar20;
  binary *InBuffer;
  uint uVar21;
  binary *pbVar22;
  uint32 uVar23;
  ulong uVar24;
  binary *pbVar25;
  uint32 SizeRead;
  KaxInternalBlock *local_80;
  vector<int,_std::allocator<int>_> *local_78;
  uint64 SizeUnknown;
  binary *local_68;
  binary *local_60;
  SafeReadIOCallback Mem;
  DataBuffer *lacedFrame;
  filepos_t local_38;
  
  iVar7 = (*input->_vptr_IOCallback[5])(input);
  this->FirstFrameLocation = CONCAT44(extraout_var_00,iVar7);
  (this->super_EbmlBinary).super_EbmlElement.bValueIsSet = false;
  local_80 = this;
  if (ReadFully == SCOPE_PARTIAL_DATA) {
    lVar20 = 5;
    iVar7 = (*input->_vptr_IOCallback[2])(input,&SizeUnknown,5);
    if (iVar7 != 5) {
      pEVar11 = (EndOfStreamX *)__cxa_allocate_exception(8);
      libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX(pEVar11,0);
      __cxa_throw(pEVar11,&libebml::SafeReadIOCallback::EndOfStreamX::typeinfo,0);
    }
    bVar4 = (byte)SizeUnknown;
    this->TrackNumber = (ushort)(byte)SizeUnknown;
    if ((char)(byte)SizeUnknown < '\0') {
      pbVar25 = (binary *)((long)&SizeUnknown + 1);
      uVar5 = (byte)SizeUnknown & 0x7f;
      lVar20 = 4;
    }
    else {
      if ((byte)SizeUnknown < 0x40) {
        return 5;
      }
      pbVar25 = (binary *)((long)&SizeUnknown + 2);
      uVar5 = ((byte)SizeUnknown & 0x3f) << 8;
      this->TrackNumber = uVar5;
      uVar5 = SizeUnknown._1_1_ | uVar5;
    }
    this->TrackNumber = uVar5;
    libebml::Endian<short,_(libebml::endianess)0>::Eval
              ((Endian<short,_(libebml::endianess)0> *)&lacedFrame,pbVar25);
    this->LocalTimecode = (int16)lacedFrame;
    this->bLocalTimecodeUsed = true;
    iVar7 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[3])(this);
    bVar1 = pbVar25[2];
    if ((*(long *)(KaxSimpleBlock::ClassInfos._8_8_ + 8) ==
         *(long *)((int *)CONCAT44(extraout_var_08,iVar7) + 2)) &&
       (*(int *)KaxSimpleBlock::ClassInfos._8_8_ == *(int *)CONCAT44(extraout_var_08,iVar7))) {
      this->bIsKeyframe = (bool)(bVar1 >> 7);
      this->bIsDiscardable = (bool)(bVar1 & 1);
    }
    LVar17 = bVar1 >> 1 & LACING_EBML;
    this->mInvisible = (bool)(bVar1 >> 3 & 1);
    this->mLacing = LVar17;
    if ((char)bVar4 < '\0') {
      uVar3 = SizeUnknown._4_1_;
      SizeUnknown = CONCAT71(SizeUnknown._1_7_,uVar3);
    }
    else {
      (*input->_vptr_IOCallback[2])(input,&SizeUnknown,1);
      LVar17 = this->mLacing;
    }
    this->FirstFrameLocation = this->FirstFrameLocation + lVar20;
    if (LVar17 == LACING_NONE) {
      std::vector<int,_std::allocator<int>_>::resize(&this->SizeList,1);
      iVar7 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
      *(this->SizeList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start = iVar7 - (uint)lVar20;
    }
    else {
      iVar7 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
      bVar4 = (byte)SizeUnknown;
      pbVar25 = (binary *)(SizeUnknown & 0xff);
      local_78 = &this->SizeList;
      std::vector<int,_std::allocator<int>_>::resize(local_78,(size_type)(pbVar25 + 1));
      uVar21 = iVar7 + ~(uint)lVar20;
      LVar17 = this->mLacing;
      if (LVar17 == LACING_EBML) {
        uVar19 = (ulong)((uint)bVar4 * 4);
        SizeRead = uVar21;
        pbVar22 = (binary *)operator_new__(uVar19);
        (*input->_vptr_IOCallback[2])(input,pbVar22,uVar19);
        uVar13 = libebml::ReadCodedSizeValue(pbVar22,&SizeRead,(uint64 *)&Mem);
        piVar18 = (local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        *piVar18 = (int)uVar13;
        uVar23 = (uVar21 - SizeRead) - (int)uVar13;
        InBuffer = pbVar22 + SizeRead;
        local_68 = pbVar22;
        for (pbVar12 = (binary *)0x1; pbVar12 < pbVar25; pbVar12 = pbVar12 + 1) {
          SizeRead = uVar23;
          iVar14 = libebml::ReadCodedSizeSignedValue(InBuffer,&SizeRead,(uint64 *)&Mem);
          uVar13 = iVar14 + (int)uVar13;
          piVar18 = (local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          piVar18[(long)pbVar12] = (int)uVar13;
          InBuffer = InBuffer + SizeRead;
          uVar23 = uVar23 - (SizeRead + (int)uVar13);
        }
        this->FirstFrameLocation = (uint64)(InBuffer + (this->FirstFrameLocation - (long)local_68));
        piVar18[(long)pbVar12] = uVar23;
        operator_delete__(local_68);
      }
      else if (LVar17 == LACING_FIXED) {
        piVar18 = (local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        for (uVar19 = 0; (bVar4 + 1 & 0xff) != uVar19; uVar19 = uVar19 + 1) {
          piVar18[uVar19] = (int)((ulong)uVar21 / (ulong)(pbVar25 + 1));
        }
      }
      else {
        if (LVar17 != LACING_XIPH) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                        ,0x2b2,
                        "virtual filepos_t libmatroska::KaxInternalBlock::ReadData(IOCallback &, ScopeMode)"
                       );
        }
        pbVar12 = (binary *)0x0;
        local_60 = pbVar25;
        while (pbVar12 != local_60) {
          iVar7 = 0;
          local_68 = pbVar12;
          do {
            (*input->_vptr_IOCallback[2])(input,&SizeUnknown,1);
            iVar7 = iVar7 + (uint)(byte)SizeUnknown;
            uVar21 = uVar21 - 1;
            uVar13 = this->FirstFrameLocation;
            this->FirstFrameLocation = uVar13 + 1;
          } while ((byte)SizeUnknown == 0xff);
          this->FirstFrameLocation = uVar13 + 2;
          (this->SizeList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(long)local_68] = iVar7;
          uVar21 = uVar21 - iVar7;
          pbVar12 = local_68 + 1;
        }
        (local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[(long)local_60] = uVar21;
      }
    }
    (this->super_EbmlBinary).super_EbmlElement.bValueIsSet = false;
    iVar7 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
    return CONCAT44(extraout_var_09,iVar7);
  }
  if (ReadFully != SCOPE_ALL_DATA) {
    iVar7 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
    return CONCAT44(extraout_var_02,iVar7);
  }
  fVar9 = libebml::EbmlBinary::ReadData(&this->super_EbmlBinary,input,SCOPE_ALL_DATA);
  iVar7 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
  if (fVar9 != CONCAT44(extraout_var_01,iVar7)) {
    pEVar11 = (EndOfStreamX *)__cxa_allocate_exception(8);
    iVar7 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
    libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX
              (pEVar11,CONCAT44(extraout_var_10,iVar7) - fVar9);
    __cxa_throw(pEVar11,&libebml::SafeReadIOCallback::EndOfStreamX::typeinfo,0);
  }
  local_68 = (this->super_EbmlBinary).Data;
  libebml::SafeReadIOCallback::SafeReadIOCallback(&Mem,&this->super_EbmlBinary);
  bVar4 = libebml::SafeReadIOCallback::GetUInt8(&Mem);
  this->TrackNumber = (ushort)bVar4;
  if ((char)bVar4 < '\0') {
    uVar21 = 4;
    uVar5 = (ushort)(bVar4 & 0x7f);
  }
  else {
    if (bVar4 < 0x40) {
      pEVar11 = (EndOfStreamX *)__cxa_allocate_exception(8);
      libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX(pEVar11,0);
      __cxa_throw(pEVar11,&libebml::SafeReadIOCallback::EndOfStreamX::typeinfo,0);
    }
    this->TrackNumber = (ushort)(bVar4 & 0x3f) << 8;
    bVar4 = libebml::SafeReadIOCallback::GetUInt8(&Mem);
    uVar21 = 5;
    uVar5 = (ushort)bVar4 + this->TrackNumber;
  }
  this->TrackNumber = uVar5;
  uVar6 = libebml::SafeReadIOCallback::GetUInt16BE(&Mem);
  this->LocalTimecode = uVar6;
  this->bLocalTimecodeUsed = true;
  bVar4 = libebml::SafeReadIOCallback::GetUInt8(&Mem);
  iVar7 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[3])(this);
  if ((*(long *)(KaxSimpleBlock::ClassInfos._8_8_ + 8) ==
       *(long *)((int *)CONCAT44(extraout_var_03,iVar7) + 2)) &&
     (*(int *)KaxSimpleBlock::ClassInfos._8_8_ == *(int *)CONCAT44(extraout_var_03,iVar7))) {
    this->bIsKeyframe = (bool)(bVar4 >> 7);
    this->bIsDiscardable = (bool)(bVar4 & 1);
  }
  this->mInvisible = (bool)(bVar4 >> 3 & 1);
  LVar17 = bVar4 >> 1 & LACING_EBML;
  this->mLacing = LVar17;
  local_38 = fVar9;
  if ((char)LVar17 == '\0') {
    sVar15 = libebml::SafeReadIOCallback::GetPosition(&Mem);
    this->FirstFrameLocation = this->FirstFrameLocation + sVar15;
    puVar10 = (undefined8 *)operator_new(0x28);
    sVar15 = libebml::SafeReadIOCallback::GetPosition(&Mem);
    iVar7 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
    *puVar10 = &PTR__DataBuffer_001df5c0;
    *(uint *)(puVar10 + 2) = iVar7 - uVar21;
    *(undefined1 *)((long)puVar10 + 0x14) = 1;
    puVar10[3] = 0;
    *(undefined1 *)(puVar10 + 4) = 0;
    puVar10[1] = local_68 + sVar15;
    SizeUnknown = (uint64)puVar10;
    std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>::push_back
              (&this->myBuffers,(value_type *)&SizeUnknown);
    std::vector<int,_std::allocator<int>_>::resize(&this->SizeList,1);
    iVar7 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
    *(this->SizeList).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_start = iVar7 - uVar21;
    goto LAB_00197343;
  }
  iVar7 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
  bVar4 = libebml::SafeReadIOCallback::GetUInt8(&Mem);
  local_60 = (binary *)CONCAT71(extraout_var,bVar4);
  local_78 = &this->SizeList;
  uVar19 = (ulong)bVar4;
  std::vector<int,_std::allocator<int>_>::resize(local_78,(ulong)(bVar4 + 1));
  uVar21 = iVar7 + ~uVar21;
  LVar17 = this->mLacing;
  if (LVar17 == LACING_EBML) {
    SizeRead = uVar21;
    sVar15 = libebml::SafeReadIOCallback::GetPosition(&Mem);
    uVar13 = libebml::ReadCodedSizeValue(local_68 + sVar15,&SizeRead,&SizeUnknown);
    iVar7 = (int)uVar13;
    if ((iVar7 == 0) || (uVar21 < SizeRead + iVar7)) {
      pEVar11 = (EndOfStreamX *)__cxa_allocate_exception(8);
      libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX(pEVar11,(ulong)SizeRead);
LAB_001978cd:
      __cxa_throw(pEVar11,&libebml::SafeReadIOCallback::EndOfStreamX::typeinfo,0);
    }
    *(local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
     _M_start = iVar7;
    libebml::SafeReadIOCallback::Skip(&Mem,(ulong)SizeRead);
    uVar21 = uVar21 - (SizeRead + iVar7);
    for (uVar24 = 1; uVar24 < uVar19; uVar24 = uVar24 + 1) {
      SizeRead = uVar21;
      sVar15 = libebml::SafeReadIOCallback::GetPosition(&Mem);
      iVar14 = libebml::ReadCodedSizeSignedValue(local_68 + sVar15,&SizeRead,&SizeUnknown);
      uVar13 = iVar14 + (int)uVar13;
      iVar7 = (int)uVar13;
      if ((iVar7 == 0) || (uVar21 < SizeRead + iVar7)) {
        pEVar11 = (EndOfStreamX *)__cxa_allocate_exception(8);
        libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX(pEVar11,(ulong)SizeRead);
        goto LAB_001978cd;
      }
      (local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar24] = iVar7;
      libebml::SafeReadIOCallback::Skip(&Mem,(ulong)SizeRead);
      uVar21 = uVar21 - (SizeRead + iVar7);
    }
    uVar19 = uVar24;
    if ((byte)uVar24 <= (byte)local_60) goto LAB_001976ee;
  }
  else if (LVar17 == LACING_FIXED) {
    piVar18 = (local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    for (uVar19 = 0; ((int)local_60 + 1U & 0xff) != uVar19; uVar19 = uVar19 + 1) {
      piVar18[uVar19] = uVar21 / (bVar4 + 1);
    }
  }
  else {
    if (LVar17 != LACING_XIPH) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                    ,0x22e,
                    "virtual filepos_t libmatroska::KaxInternalBlock::ReadData(IOCallback &, ScopeMode)"
                   );
    }
    for (uVar24 = 0; uVar24 != uVar19; uVar24 = uVar24 + 1) {
      iVar7 = 0;
      do {
        bVar4 = libebml::SafeReadIOCallback::GetUInt8(&Mem);
        iVar7 = iVar7 + (uint)bVar4;
        uVar21 = uVar21 - 1;
      } while (bVar4 == 0xff);
      (local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar24] = iVar7;
      uVar21 = uVar21 - iVar7;
    }
LAB_001976ee:
    (local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_start[uVar19] = uVar21;
  }
  sVar15 = libebml::SafeReadIOCallback::GetPosition(&Mem);
  this->FirstFrameLocation = this->FirstFrameLocation + sVar15;
  this_00 = &this->myBuffers;
  for (bVar4 = 0; bVar4 <= (byte)local_60; bVar4 = bVar4 + 1) {
    pDVar16 = (DataBuffer *)operator_new(0x28);
    sVar15 = libebml::SafeReadIOCallback::GetPosition(&Mem);
    uVar23 = (local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start[bVar4];
    pDVar16->_vptr_DataBuffer = (_func_int **)&PTR__DataBuffer_001df5c0;
    pDVar16->mySize = uVar23;
    pDVar16->bValidValue = true;
    pDVar16->myFreeBuffer = (_func_bool_DataBuffer_ptr *)0x0;
    pDVar16->bInternalBuffer = false;
    pDVar16->myBuffer = local_68 + sVar15;
    lacedFrame = pDVar16;
    std::vector<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>::push_back
              (this_00,&lacedFrame);
    libebml::SafeReadIOCallback::Skip
              (&Mem,(long)(local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[bVar4]);
    this = local_80;
  }
LAB_00197343:
  iVar7 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
  pbVar25 = local_68 + CONCAT44(extraout_var_04,iVar7);
  uVar24 = (long)(this->myBuffers).
                 super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->myBuffers).
                 super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3;
  uVar19 = 1;
  do {
    pKVar2 = local_80;
    if (uVar19 - uVar24 == 1) {
      (local_80->super_EbmlBinary).super_EbmlElement.bValueIsSet = true;
      libebml::SafeReadIOCallback::~SafeReadIOCallback(&Mem);
      return local_38;
    }
    iVar7 = (*(local_80->myBuffers).
              super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar19 - 1]->_vptr_DataBuffer[2])();
    iVar8 = (*(pKVar2->myBuffers).
              super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar19 - 1]->_vptr_DataBuffer[3])();
    uVar21 = *(uint *)CONCAT44(extraout_var_06,iVar8);
    pbVar12 = pbVar25;
    if (uVar19 < uVar24) {
      iVar8 = (*(local_80->myBuffers).
                super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar19]->_vptr_DataBuffer[2])();
      pbVar12 = (binary *)CONCAT44(extraout_var_07,iVar8);
    }
  } while (((local_68 <= (binary *)CONCAT44(extraout_var_05,iVar7)) &&
           (pbVar22 = (binary *)CONCAT44(extraout_var_05,iVar7) + uVar21, pbVar22 <= pbVar25)) &&
          (uVar19 = uVar19 + 1, pbVar22 == pbVar12));
  pEVar11 = (EndOfStreamX *)__cxa_allocate_exception(8);
  libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX(pEVar11,0);
  __cxa_throw(pEVar11,&libebml::SafeReadIOCallback::EndOfStreamX::typeinfo,0);
}

Assistant:

filepos_t KaxInternalBlock::ReadData(IOCallback & input, ScopeMode ReadFully)
{
  filepos_t Result;

  FirstFrameLocation = input.getFilePointer(); // will be updated accordingly below

  SetValueIsSet(false);

  try {
    if (ReadFully == SCOPE_ALL_DATA) {
      Result = EbmlBinary::ReadData(input, ReadFully);
      if (Result != GetSize())
        throw SafeReadIOCallback::EndOfStreamX(GetSize() - Result);

      binary *BufferStart = EbmlBinary::GetBuffer();

      SafeReadIOCallback Mem(*this);
      uint8 BlockHeadSize = 4;

      // update internal values
      TrackNumber = Mem.GetUInt8();
      if ((TrackNumber & 0x80) == 0) {
        // there is extra data
        if ((TrackNumber & 0x40) == 0) {
          // We don't support track numbers that large !
          throw SafeReadIOCallback::EndOfStreamX(0);
        }
        TrackNumber = (TrackNumber & 0x3F) << 8;
        TrackNumber += Mem.GetUInt8();
        BlockHeadSize++;
      } else {
        TrackNumber &= 0x7F;
      }

      LocalTimecode = int16(Mem.GetUInt16BE());
      bLocalTimecodeUsed = true;

      uint8 Flags = Mem.GetUInt8();
      if (EbmlId(*this) == EBML_ID(KaxSimpleBlock)) {
        bIsKeyframe = (Flags & 0x80) != 0;
        bIsDiscardable = (Flags & 0x01) != 0;
      }
      mInvisible = (Flags & 0x08) >> 3;
      mLacing = LacingType((Flags & 0x06) >> 1);

      // put all Frames in the list
      if (mLacing == LACING_NONE) {
        FirstFrameLocation += Mem.GetPosition();
        DataBuffer * soloFrame = new DataBuffer(BufferStart + Mem.GetPosition(), GetSize() - BlockHeadSize);
        myBuffers.push_back(soloFrame);
        SizeList.resize(1);
        SizeList[0] = GetSize() - BlockHeadSize;
      } else {
        // read the number of frames in the lace
        uint32 LastBufferSize = GetSize() - BlockHeadSize - 1; // 1 for number of frame
        uint8 FrameNum = Mem.GetUInt8(); // number of frames in the lace - 1
        // read the list of frame sizes
        uint8 Index;
        int32 FrameSize;
        uint32 SizeRead;
        uint64 SizeUnknown;

        SizeList.resize(FrameNum + 1);

        switch (mLacing) {
          case LACING_XIPH:
            for (Index=0; Index<FrameNum; Index++) {
              // get the size of the frame
              FrameSize = 0;
              uint8 Value;
              do {
                Value = Mem.GetUInt8();
                FrameSize += Value;
                LastBufferSize--;
              } while (Value == 0xFF);
              SizeList[Index] = FrameSize;
              LastBufferSize -= FrameSize;
            }
            SizeList[Index] = LastBufferSize;
            break;
          case LACING_EBML:
            SizeRead = LastBufferSize;
            FrameSize = ReadCodedSizeValue(BufferStart + Mem.GetPosition(), SizeRead, SizeUnknown);
            if (!FrameSize || (static_cast<uint32>(FrameSize + SizeRead) > LastBufferSize))
              throw SafeReadIOCallback::EndOfStreamX(SizeRead);
            SizeList[0] = FrameSize;
            Mem.Skip(SizeRead);
            LastBufferSize -= FrameSize + SizeRead;

            for (Index=1; Index<FrameNum; Index++) {
              // get the size of the frame
              SizeRead = LastBufferSize;
              FrameSize += ReadCodedSizeSignedValue(BufferStart + Mem.GetPosition(), SizeRead, SizeUnknown);
              if (!FrameSize || (static_cast<uint32>(FrameSize + SizeRead) > LastBufferSize))
                throw SafeReadIOCallback::EndOfStreamX(SizeRead);
              SizeList[Index] = FrameSize;
              Mem.Skip(SizeRead);
              LastBufferSize -= FrameSize + SizeRead;
            }
            if (Index <= FrameNum) // Safety check if FrameNum == 0
              SizeList[Index] = LastBufferSize;
            break;
          case LACING_FIXED:
            for (Index=0; Index<=FrameNum; Index++) {
              // get the size of the frame
              SizeList[Index] = LastBufferSize / (FrameNum + 1);
            }
            break;
          default: // other lacing not supported
            assert(0);
        }

        FirstFrameLocation += Mem.GetPosition();

        for (Index=0; Index<=FrameNum; Index++) {
          DataBuffer * lacedFrame = new DataBuffer(BufferStart + Mem.GetPosition(), SizeList[Index]);
          myBuffers.push_back(lacedFrame);
          Mem.Skip(SizeList[Index]);
        }
      }

      binary *BufferEnd = BufferStart + GetSize();
      size_t NumFrames  = myBuffers.size();

      // Sanity checks for frame pointers and boundaries.
      for (size_t Index = 0; Index < NumFrames; ++Index) {
        binary *FrameStart  = myBuffers[Index]->Buffer();
        binary *FrameEnd    = FrameStart + myBuffers[Index]->Size();
        binary *ExpectedEnd = (Index + 1) < NumFrames ? myBuffers[Index + 1]->Buffer() : BufferEnd;

        if ((FrameStart < BufferStart) || (FrameEnd > BufferEnd) || (FrameEnd != ExpectedEnd))
          throw SafeReadIOCallback::EndOfStreamX(0);
      }

      SetValueIsSet();
    } else if (ReadFully == SCOPE_PARTIAL_DATA) {
      binary _TempHead[5];
      Result = input.read(_TempHead, 5);
      if (Result != 5)
        throw SafeReadIOCallback::EndOfStreamX(0);
      binary *cursor = _TempHead;
      binary *_tmpBuf;
      uint8 BlockHeadSize = 4;

      // update internal values
      TrackNumber = *cursor++;
      if ((TrackNumber & 0x80) == 0) {
        // there is extra data
        if ((TrackNumber & 0x40) == 0) {
          // We don't support track numbers that large !
          return Result;
        }
        TrackNumber = (TrackNumber & 0x3F) << 8;
        TrackNumber += *cursor++;
        BlockHeadSize++;
      } else {
        TrackNumber &= 0x7F;
      }

      big_int16 b16;
      b16.Eval(cursor);
      LocalTimecode = int16(b16);
      bLocalTimecodeUsed = true;
      cursor += 2;

      if (EbmlId(*this) == EBML_ID(KaxSimpleBlock)) {
        bIsKeyframe = (*cursor & 0x80) != 0;
        bIsDiscardable = (*cursor & 0x01) != 0;
      }
      mInvisible = (*cursor & 0x08) >> 3;
      mLacing = LacingType((*cursor++ & 0x06) >> 1);
      if (cursor == &_TempHead[4]) {
        _TempHead[0] = _TempHead[4];
      } else {
        Result += input.read(_TempHead, 1);
      }

      FirstFrameLocation += cursor - _TempHead;

      // put all Frames in the list
      if (mLacing != LACING_NONE) {
        // read the number of frames in the lace
        uint32 LastBufferSize = GetSize() - BlockHeadSize - 1; // 1 for number of frame
        uint8 FrameNum = _TempHead[0]; // number of frames in the lace - 1
        // read the list of frame sizes
        uint8 Index;
        int32 FrameSize;
        uint32 SizeRead;
        uint64 SizeUnknown;

        SizeList.resize(FrameNum + 1);

        switch (mLacing) {
          case LACING_XIPH:
            for (Index=0; Index<FrameNum; Index++) {
              // get the size of the frame
              FrameSize = 0;
              do {
                Result += input.read(_TempHead, 1);
                FrameSize += uint8(_TempHead[0]);
                LastBufferSize--;

                FirstFrameLocation++;
              } while (_TempHead[0] == 0xFF);

              FirstFrameLocation++;
              SizeList[Index] = FrameSize;
              LastBufferSize -= FrameSize;
            }
            SizeList[Index] = LastBufferSize;
            break;
          case LACING_EBML:
            SizeRead = LastBufferSize;
            cursor = _tmpBuf = new binary[FrameNum*4]; /// \warning assume the mean size will be coded in less than 4 bytes
            Result += input.read(cursor, FrameNum*4);
            FrameSize = ReadCodedSizeValue(cursor, SizeRead, SizeUnknown);
            SizeList[0] = FrameSize;
            cursor += SizeRead;
            LastBufferSize -= FrameSize + SizeRead;

            for (Index=1; Index<FrameNum; Index++) {
              // get the size of the frame
              SizeRead = LastBufferSize;
              FrameSize += ReadCodedSizeSignedValue(cursor, SizeRead, SizeUnknown);
              SizeList[Index] = FrameSize;
              cursor += SizeRead;
              LastBufferSize -= FrameSize + SizeRead;
            }

            FirstFrameLocation += cursor - _tmpBuf;

            SizeList[Index] = LastBufferSize;
            delete [] _tmpBuf;
            break;
          case LACING_FIXED:
            for (Index=0; Index<=FrameNum; Index++) {
              // get the size of the frame
              SizeList[Index] = LastBufferSize / (FrameNum + 1);
            }
            break;
          default: // other lacing not supported
            assert(0);
        }
      } else {
        SizeList.resize(1);
        SizeList[0] = GetSize() - BlockHeadSize;
      }
      SetValueIsSet(false);
      Result = GetSize();
    } else {
      SetValueIsSet(false);
      Result = GetSize();
    }

  } catch (SafeReadIOCallback::EndOfStreamX &) {
    SetValueIsSet(false);

    std::memset(EbmlBinary::GetBuffer(), 0, GetSize());
    myBuffers.clear();
    SizeList.clear();
    Timecode           = 0;
    LocalTimecode      = 0;
    TrackNumber        = 0;
    bLocalTimecodeUsed = false;
    FirstFrameLocation = 0;

    return 0;
  }

  return Result;
}